

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O0

double mp::ComputeValue<mp::VarInfoRecomp>(ImplicationConstraint *con,VarInfoRecomp *x)

{
  VarInfoImpl<mp::VarVecRecomp> *in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double c2;
  double c1;
  double i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar4;
  
  CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>::GetArguments
            ((CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId> *)
             (in_RDI + 0x28));
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)in_RSI,
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,
                               CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))));
  dVar1 = VarInfoImpl<mp::VarVecRecomp>::operator[]
                    (in_RSI,CONCAT13(in_stack_ffffffffffffffbf,
                                     CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)))
  ;
  CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>::GetArguments
            ((CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId> *)
             (in_RDI + 0x28));
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)in_RSI,
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,
                               CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))));
  dVar2 = VarInfoImpl<mp::VarVecRecomp>::operator[]
                    (in_RSI,CONCAT13(in_stack_ffffffffffffffbf,
                                     CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)))
  ;
  CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId>::GetArguments
            ((CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::ImplicationId> *)
             (in_RDI + 0x28));
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)in_RSI,
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,
                               CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))));
  dVar3 = VarInfoImpl<mp::VarVecRecomp>::operator[]
                    (in_RSI,CONCAT13(in_stack_ffffffffffffffbf,
                                     CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)))
  ;
  if ((dVar1 < 0.5) || (bVar4 = true, dVar2 < 0.5)) {
    bVar4 = dVar1 < 0.5 && 0.5 <= dVar3;
  }
  return (double)bVar4;
}

Assistant:

double ComputeValue(const ImplicationConstraint& con, const VarVec& x) {
  auto i = x[con.GetArguments()[0]];
  auto c1 = x[con.GetArguments()[1]];
  auto c2 = x[con.GetArguments()[2]];
  return (i>=0.5 && c1>=0.5) || (i<0.5 && c2>=0.5);
}